

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void __thiscall pixels::fillRandom(pixels *this)

{
  unsigned_short uVar1;
  undefined2 uVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Rand48 rand;
  ushort local_36 [3];
  
  if (0 < this->_h) {
    iVar5 = 0;
    do {
      if (0 < this->_w) {
        iVar8 = 0;
        do {
          lVar6 = (long)(this->_stride_x * iVar5 + iVar8);
          uVar3 = Imath_3_2::nrand48(local_36);
          (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = uVar3;
          uVar1 = Imath_3_2::nrand48(local_36);
          (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = uVar1;
          lVar7 = 0x58;
          do {
            uVar2 = Imath_3_2::nrand48(local_36);
            *(undefined2 *)(*(long *)((long)this->rgba + lVar7 + -0x58) + lVar6 * 2) = uVar2;
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0xb8);
          fVar4 = (float)Imath_3_2::nrand48(local_36);
          (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = fVar4;
          iVar8 = iVar8 + 1;
        } while (iVar8 < this->_w);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->_h);
  }
  return;
}

Assistant:

inline int
shiftAndRound (int x, int shift)
{
    x <<= 1;
    int a = (1 << shift) - 1;
    shift += 1;
    int b = (x >> shift) & 1;
    return (x + a + b) >> shift;
}